

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTable.cpp
# Opt level: O1

void QTable::Save(QTables *Qs,string *filename)

{
  pointer pQVar1;
  size_type sVar2;
  size_type sVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  long lVar6;
  size_type sVar7;
  size_type sVar8;
  long lVar9;
  ofstream fp;
  stringstream ss;
  long local_3d8;
  long local_3b8;
  filebuf local_3b0 [24];
  byte abStack_398 [216];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::ofstream::ofstream(&local_3b8,(filename->_M_dataplus)._M_p,_S_out);
  if ((abStack_398[*(long *)(local_3b8 + -0x18)] & 5) == 0) {
    *(undefined8 *)(local_3b0 + *(long *)(local_3b8 + -0x18)) = 0x10;
    pQVar1 = (Qs->super__Vector_base<QTable,_std::allocator<QTable>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = (long)(Qs->super__Vector_base<QTable,_std::allocator<QTable>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pQVar1;
    if (lVar6 != 0) {
      sVar2 = (pQVar1->super_matrix_t).size1_;
      sVar3 = (pQVar1->super_matrix_t).size2_;
      local_3d8 = 0;
      do {
        if (sVar2 != 0) {
          lVar9 = 0;
          sVar8 = 0;
          do {
            if (sVar3 != 0) {
              sVar7 = 0;
              do {
                pQVar1 = (Qs->super__Vector_base<QTable,_std::allocator<QTable>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                std::ostream::_M_insert<double>
                          (*(double *)
                            ((long)pQVar1[local_3d8].super_matrix_t.data_.data_ +
                            sVar7 * 8 + pQVar1[local_3d8].super_matrix_t.size2_ * lVar9));
                if (sVar3 - 1 != sVar7) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3b8," ",1);
                }
                sVar7 = sVar7 + 1;
              } while (sVar3 != sVar7);
            }
            std::ios::widen((char)*(undefined8 *)(local_3b8 + -0x18) + (char)&local_3b8);
            std::ostream::put((char)&local_3b8);
            std::ostream::flush();
            sVar8 = sVar8 + 1;
            lVar9 = lVar9 + 8;
          } while (sVar8 != sVar2);
        }
        local_3d8 = local_3d8 + 1;
      } while (local_3d8 != (lVar6 >> 4) * -0x5555555555555555);
    }
    local_3b8 = _VTT;
    *(undefined8 *)(local_3b0 + *(long *)(_VTT + -0x18) + -8) = __M_insert<void_const*>;
    std::filebuf::~filebuf(local_3b0);
    std::ios_base::~ios_base(local_2c0);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"QTable::Save: failed to open file ",0x22);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  std::endl<char,std::char_traits<char>>(poVar4);
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar5 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar5,&E::typeinfo,E::~E);
}

Assistant:

void QTable::Save(const QTables &Qs, const std::string &filename)
{
    ofstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "QTable::Save: failed to open file " << filename << endl;
        throw E(ss);
    }

    fp.precision(16);

    size_t nrRows=Qs[0].size1(),
        nrColumns=Qs[0].size2(),
        h=Qs.size();

    for(size_t k=0;k!=h;++k)
        for(size_t s=0;s!=nrRows;++s)
        {
            for(size_t a=0;a!=nrColumns;++a)
            {
                fp << Qs[k](s,a);
                if(a!=nrColumns-1)
                    fp << " ";
            }
            fp << endl;
        }
}